

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O1

int BN_mod_mul_montgomery(BIGNUM *r,BIGNUM *a,BIGNUM *b,BN_MONT_CTX *mont,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *r_00;
  int iVar3;
  
  iVar3 = (mont->N).top;
  if (((1 < iVar3) && (a->top == iVar3)) && (b->top == iVar3)) {
    pBVar2 = bn_wexpand((BIGNUM *)r,iVar3);
    if (pBVar2 == (BIGNUM *)0x0) {
      return 0;
    }
    iVar1 = bn_mul_mont(r->d,a->d,b->d,(mont->N).d,mont->n0,iVar3);
    if (iVar1 != 0) {
      r->neg = b->neg ^ a->neg;
      r->top = iVar3;
      bn_correct_top((BIGNUM *)r);
      return 1;
    }
  }
  BN_CTX_start(ctx);
  r_00 = BN_CTX_get(ctx);
  iVar3 = 0;
  if (r_00 != (BIGNUM *)0x0) {
    if (a == b) {
      iVar1 = BN_sqr(r_00,a,ctx);
    }
    else {
      iVar1 = BN_mul(r_00,a,b,ctx);
    }
    if (iVar1 != 0) {
      iVar3 = BN_from_montgomery_word((BIGNUM *)r,(BIGNUM *)r_00,(BN_MONT_CTX *)mont);
    }
  }
  BN_CTX_end(ctx);
  return iVar3;
}

Assistant:

int BN_mod_mul_montgomery(BIGNUM *r, const BIGNUM *a, const BIGNUM *b,
                          BN_MONT_CTX *mont, BN_CTX *ctx)
{
    BIGNUM *tmp;
    int ret = GML_ERROR;
#if defined(MONT_WORD)
    int num = mont->N.top;

    if (num > 1 && a->top == num && b->top == num) {
        if (bn_wexpand(r, num) == NULL)
            return (0);

        if (bn_mul_mont(r->d, a->d, b->d, mont->N.d, mont->n0, num)) {
            r->neg = a->neg ^ b->neg;
            r->top = num;
            bn_correct_top(r);
            return (1);
        }
    }
#endif

    BN_CTX_start(ctx);
    tmp = BN_CTX_get(ctx);
    if (tmp == NULL)
        goto err;

    bn_check_top(tmp);
    if (a == b) {
        if (!BN_sqr(tmp, a, ctx))
            goto err;
    } else {
        if (!BN_mul(tmp, a, b, ctx))
            goto err;
    }
    /* reduce from aRR to aR */
#ifdef MONT_WORD
    if (!BN_from_montgomery_word(r, tmp, mont))
        goto err;
#else
    if (!BN_from_montgomery(r, tmp, mont, ctx))
        goto err;
#endif
    bn_check_top(r);
    ret = 1;
 err:
    BN_CTX_end(ctx);
    return (ret);
}